

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsModule.c
# Opt level: O1

int init(EVP_PKEY_CTX *ctx)

{
  MCRegisterInfo *MRI;
  uint8_t *puVar1;
  
  if ((*(uint *)(ctx + 4) & 0xfffffff1) != 0) {
    return 5;
  }
  MRI = (MCRegisterInfo *)(*cs_mem_malloc)(0x58);
  X86_init(MRI);
  *(code **)(ctx + 8) = X86_Intel_printInst;
  *(undefined4 *)(ctx + 0x6c) = 1;
  *(MCRegisterInfo **)(ctx + 0x10) = MRI;
  *(code **)(ctx + 0x18) = X86_getInstruction;
  *(code **)(ctx + 0x30) = X86_reg_name;
  *(code **)(ctx + 0x48) = X86_get_insn_id;
  *(code **)(ctx + 0x38) = X86_insn_name;
  *(code **)(ctx + 0x40) = X86_group_name;
  *(undefined8 *)(ctx + 0x50) = 0;
  if (*(int *)(ctx + 4) == 8) {
    puVar1 = regsize_map_64;
  }
  else {
    puVar1 = regsize_map_32;
  }
  *(uint8_t **)(ctx + 0xa8) = puVar1;
  return 0;
}

Assistant:

static cs_err init(cs_struct *ud)
{
	MCRegisterInfo *mri;

	// verify if requested mode is valid
	if (ud->mode & ~(CS_MODE_LITTLE_ENDIAN | CS_MODE_32 | CS_MODE_64 |
				CS_MODE_MICRO | CS_MODE_MIPS32R6 |
				CS_MODE_MIPSGP64 | CS_MODE_BIG_ENDIAN))
		return CS_ERR_MODE;

	mri = cs_mem_malloc(sizeof(*mri));

	Mips_init(mri);
	ud->printer = Mips_printInst;
	ud->printer_info = mri;
	ud->getinsn_info = mri;
	ud->reg_name = Mips_reg_name;
	ud->insn_id = Mips_get_insn_id;
	ud->insn_name = Mips_insn_name;
	ud->group_name = Mips_group_name;

	if (ud->mode & CS_MODE_32 || ud->mode & CS_MODE_MIPS32R6)
		ud->disasm = Mips_getInstruction;
	else
		ud->disasm = Mips64_getInstruction;

	return CS_ERR_OK;
}